

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int bitset_container_index_equalorlarger(bitset_container_t *container,uint16_t x)

{
  int iVar1;
  ulong uStack_30;
  int diff;
  uint64_t word;
  uint32_t k;
  uint32_t x32;
  uint16_t x_local;
  bitset_container_t *container_local;
  
  word._4_4_ = (uint)(x >> 6);
  uStack_30 = (container->words[word._4_4_] >> ((byte)x & 0x3f)) << ((byte)x & 0x3f);
  while( true ) {
    if (uStack_30 != 0) {
      iVar1 = 0;
      for (; (uStack_30 & 1) == 0; uStack_30 = uStack_30 >> 1 | 0x8000000000000000) {
        iVar1 = iVar1 + 1;
      }
      return word._4_4_ * 0x40 + iVar1;
    }
    word._4_4_ = word._4_4_ + 1;
    if (word._4_4_ == 0x400) break;
    uStack_30 = container->words[word._4_4_];
  }
  return -1;
}

Assistant:

int bitset_container_index_equalorlarger(const bitset_container_t *container, uint16_t x) {
  uint32_t x32 = x;
  uint32_t k = x32 / 64;
  uint64_t word = container->words[k];
  const int diff = x32 - k * 64; // in [0,64)
  word = (word >> diff) << diff; // a mask is faster, but we don't care
  while(word == 0) {
    k++;
    if(k == BITSET_CONTAINER_SIZE_IN_WORDS) return -1;
    word = container->words[k];
  }
  return k * 64 + __builtin_ctzll(word);
}